

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImStrnicmp(char *str1,char *str2,size_t count)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  
  if (count == 0) {
    return 0;
  }
  lVar2 = 0;
  do {
    bVar1 = str2[lVar2];
    bVar3 = bVar1 & 0x5f;
    if (0x19 < (byte)(bVar1 + 0x9f)) {
      bVar3 = bVar1;
    }
    bVar1 = str1[lVar2];
    bVar4 = bVar1 & 0x5f;
    if (0x19 < (byte)(bVar1 + 0x9f)) {
      bVar4 = bVar1;
    }
    if ((int)(char)bVar3 - (int)(char)bVar4 != 0) {
      return (int)(char)bVar3 - (int)(char)bVar4;
    }
    if (bVar1 == 0) {
      return 0;
    }
    bVar5 = count - 1 != lVar2;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  return 0;
}

Assistant:

int ImStrnicmp(const char* str1, const char* str2, size_t count)
{
    int d = 0;
    while (count > 0 && (d = ImToUpper(*str2) - ImToUpper(*str1)) == 0 && *str1) { str1++; str2++; count--; }
    return d;
}